

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O1

QOperation
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::getOperation
          (char *content,SizeT *offset,SizeT end_offset)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  QOperation QVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  
  uVar5 = *offset;
  if (end_offset <= uVar5) {
    return NoOp;
  }
LAB_00113d40:
  uVar3 = (ulong)uVar5;
  bVar1 = content[uVar3];
  if (bVar1 < 0x3d) {
    switch(bVar1) {
    case 0x21:
      cVar2 = content[uVar5 + 1];
      QVar4 = NotEqual;
LAB_00113efa:
      if (cVar2 == '=') {
        return QVar4;
      }
      return Error;
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x27:
    case 0x29:
    case 0x2c:
    case 0x2e:
      break;
    case 0x25:
      return Remainder;
    case 0x26:
      return (content[uVar5 + 1] != '&') << 3 | And;
    case 0x28:
      uVar5 = uVar5 + 1;
      *offset = uVar5;
      bVar7 = uVar5 < end_offset;
      if (!bVar7) {
        return Error;
      }
      iVar6 = 0;
      uVar3 = (ulong)uVar5;
      do {
        if (content[uVar3] == '(') {
          iVar6 = iVar6 + 1;
        }
        else if (content[uVar3] == ')') {
          if (iVar6 == 0) goto LAB_00113ea2;
          iVar6 = iVar6 + -1;
        }
        uVar5 = uVar5 + 1;
        *offset = uVar5;
        bVar7 = uVar3 + 1 < (ulong)end_offset;
        uVar3 = uVar3 + 1;
        if (end_offset == uVar5) {
          return Error;
        }
      } while( true );
    case 0x2a:
      return Multiplication;
    case 0x2b:
      do {
        bVar7 = uVar3 != 0;
        if (!bVar7) goto LAB_00113e27;
        cVar2 = content[uVar3 - 1];
        uVar3 = uVar3 - 1;
      } while (cVar2 == ' ');
      if ((cVar2 == ')') || (cVar2 == '}')) {
        return Addition;
      }
      bVar7 = (byte)(cVar2 - 0x30U) < 10;
LAB_00113e27:
      if (bVar7) {
        return Addition;
      }
      break;
    case 0x2d:
      do {
        bVar7 = uVar3 != 0;
        if (!bVar7) goto LAB_00113e65;
        cVar2 = content[uVar3 - 1];
        uVar3 = uVar3 - 1;
      } while (cVar2 == ' ');
      if ((cVar2 == ')') || (cVar2 == '}')) {
        return Subtraction;
      }
      bVar7 = (byte)(cVar2 - 0x30U) < 10;
LAB_00113e65:
      if (bVar7) {
        return Subtraction;
      }
      break;
    case 0x2f:
      return Division;
    default:
      if (bVar1 == 0x3c) {
        return (content[uVar5 + 1] != '=') * '\x02' + LessOrEqual;
      }
    }
switchD_00113d62_caseD_22:
    uVar5 = uVar5 + 1;
    *offset = uVar5;
  }
  else {
    if (bVar1 < 0x7b) {
      if (bVar1 == 0x3d) {
        cVar2 = content[uVar5 + 1];
        QVar4 = Equal;
        goto LAB_00113efa;
      }
      if (bVar1 == 0x3e) {
        return (content[uVar5 + 1] != '=') * '\x02' | GreaterOrEqual;
      }
      if (bVar1 == 0x5e) {
        return Exponent;
      }
      goto switchD_00113d62_caseD_22;
    }
    if (bVar1 != 0x7b) {
      if (bVar1 == 0x7c) {
        return (content[uVar5 + 1] != '|') * '\b' + Or;
      }
      goto switchD_00113d62_caseD_22;
    }
    do {
      uVar5 = uVar5 + 1;
      *offset = uVar5;
      if (end_offset <= uVar5) goto LAB_00113eac;
    } while (content[uVar5] != '}');
    if (end_offset <= uVar5) {
LAB_00113eac:
      *offset = end_offset;
      return Error;
    }
  }
  goto LAB_00113e96;
LAB_00113ea2:
  if (!bVar7) {
    return Error;
  }
LAB_00113e96:
  if (end_offset <= uVar5) {
    return NoOp;
  }
  goto LAB_00113d40;
}

Assistant:

static QOperation getOperation(const Char_T *content, SizeT &offset, const SizeT end_offset) noexcept {
        using QOperationSymbol = QOperationSymbol_T<Char_T>;

        while (offset < end_offset) {
            switch (content[offset]) {
                case QOperationSymbol::OrExp: { // ||
                    if (content[(offset + 1)] == QOperationSymbol::OrExp) {
                        return QOperation::Or;
                    }

                    return QOperation::BitwiseOr;
                }

                case QOperationSymbol::AndExp: { // &&
                    if (content[(offset + 1)] == QOperationSymbol::AndExp) {
                        return QOperation::And;
                    }

                    return QOperation::BitwiseAnd;
                }

                case QOperationSymbol::GreaterExp: { // > or >=
                    if (content[(offset + 1)] == QOperationSymbol::EqualExp) {
                        return QOperation::GreaterOrEqual;
                    }

                    return QOperation::Greater;
                }

                case QOperationSymbol::LessExp: { // < or <=
                    if (content[(offset + 1)] == QOperationSymbol::EqualExp) {
                        return QOperation::LessOrEqual;
                    }

                    return QOperation::Less;
                }

                case QOperationSymbol::NotExp: { // !=
                    if (content[(offset + 1)] == QOperationSymbol::EqualExp) {
                        return QOperation::NotEqual;
                    }

                    return QOperation::Error;
                }

                case QOperationSymbol::EqualExp: { // ==
                    if (content[(offset + 1)] == QOperationSymbol::EqualExp) {
                        return QOperation::Equal;
                    }

                    return QOperation::Error;
                }

                case QOperationSymbol::SubtractExp: {
                    if (isExpression(content, offset)) {
                        return QOperation::Subtraction;
                    }

                    break;
                }

                case QOperationSymbol::AddExp: {
                    if (isExpression(content, offset)) {
                        return QOperation::Addition;
                    }

                    break;
                }

                case QOperationSymbol::DivideExp: {
                    return QOperation::Division;
                }

                case QOperationSymbol::MultipleExp: {
                    return QOperation::Multiplication;
                }

                case QOperationSymbol::RemainderExp: {
                    return QOperation::Remainder;
                }

                case QOperationSymbol::ExponentExp: {
                    return QOperation::Exponent;
                }

                case QOperationSymbol::ParenthesesStart: {
                    ++offset;
                    SizeT32 skip{0U};

                    while (offset < end_offset) {
                        if (content[offset] == QOperationSymbol::ParenthesesEnd) {
                            if (skip == 0U) {
                                break;
                            }

                            --skip;
                        } else if (content[offset] == QOperationSymbol::ParenthesesStart) {
                            ++skip;
                        }

                        ++offset;
                    }

                    if (offset < end_offset) {
                        continue;
                    }

                    return QOperation::Error;
                }

                case QOperationSymbol::BracketStart: {
                    do {
                        ++offset;
                    } while ((offset < end_offset) && (content[offset] != QOperationSymbol::BracketEnd));

                    if (offset < end_offset) {
                        continue;
                    }

                    offset = end_offset;
                    return QOperation::Error;
                }

                default: {
                }
            }

            ++offset;
        }

        return QOperation::NoOp;
    }